

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

int __thiscall soplex::SPxSteepPR<double>::selectLeaveHyper(SPxSteepPR<double> *this,double tol)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::soplex::infinity::__tls_init();
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  dVar12 = -*(double *)(in_FS_OFFSET + -8);
  lVar7 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar7 < 1) {
    iVar9 = -1;
    dVar11 = -1.0;
  }
  else {
    piVar6 = (this->bestPrices).super_IdxSet.idx;
    uVar8 = lVar7 + 1;
    dVar11 = -1.0;
    iVar9 = -1;
    do {
      iVar1 = piVar6[uVar8 - 2];
      dVar13 = pdVar4[iVar1];
      if (-tol <= dVar13) {
        iVar2 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar2 + -1;
        piVar6[uVar8 - 2] = piVar6[(long)iVar2 + -1];
        (pSVar3->isInfeasible).data[iVar1] = 0;
        dVar14 = dVar11;
      }
      else {
        dVar10 = pdVar5[iVar1];
        dVar14 = tol;
        if (tol <= dVar10) {
          dVar14 = dVar10;
        }
        dVar14 = (dVar13 * dVar13) / dVar14;
        dVar13 = dVar14;
        if (dVar14 <= dVar12) {
          dVar13 = dVar12;
          iVar1 = iVar9;
        }
        iVar9 = iVar1;
        dVar12 = dVar13;
        if ((0.0 <= dVar11) && (dVar11 <= dVar14)) {
          dVar14 = dVar11;
        }
      }
      dVar11 = dVar14;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  lVar7 = (long)(pSVar3->updateViols).super_IdxSet.num;
  if (0 < lVar7) {
    uVar8 = lVar7 + 1;
    do {
      pSVar3 = (this->super_SPxPricer<double>).thesolver;
      piVar6 = (pSVar3->isInfeasible).data;
      iVar1 = (pSVar3->updateViols).super_IdxSet.idx[uVar8 - 2];
      if (piVar6[iVar1] == 1) {
        dVar13 = pdVar4[iVar1];
        dVar14 = pdVar5[iVar1];
        dVar10 = tol;
        if (tol <= dVar14) {
          dVar10 = dVar14;
        }
        dVar10 = (dVar13 * dVar13) / dVar10;
        if (dVar11 < dVar10) {
          if (dVar12 < dVar10) {
            iVar9 = iVar1;
            dVar12 = dVar10;
          }
          piVar6[iVar1] = 2;
          DIdxSet::addIdx(&this->bestPrices,iVar1);
        }
      }
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  return iVar9;
}

Assistant:

int SPxSteepPR<R>::selectLeaveHyper(R tol)
{
   const R* coPen = this->thesolver->coWeights.get_const_ptr();
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   R leastBest = -1;
   R best = R(-infinity);
   R x;
   int bestIdx = -1;
   int idx = 0;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -tol)
      {
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         x = steeppr::computePrice(x, coPen[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bestIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // is this index a candidate for bestPrices?
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -tol);
         x = steeppr::computePrice(x, coPen[idx], tol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bestIdx = idx;
            }

            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bestIdx;
}